

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_base.h
# Opt level: O2

Allocation * __thiscall
density::detail::
LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,density::default_busy_wait>>
::try_inplace_allocate<1ul,true,0ul,1ul>
          (Allocation *__return_storage_ptr__,void *this,progress_guarantee i_progress_guarantee)

{
  if (i_progress_guarantee - progress_obstruction_free < 2) {
    SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,density::default_busy_wait>
    ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)2,1ul,true,0ul,1ul>
              (__return_storage_ptr__,this);
  }
  else if (i_progress_guarantee == progress_blocking) {
    SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,density::default_busy_wait>
    ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)1,1ul,true,0ul,1ul>
              (__return_storage_ptr__,this);
  }
  else {
    SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,density::default_busy_wait>
    ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)3,1ul,true,0ul,1ul>
              (__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

Allocation try_inplace_allocate(progress_guarantee i_progress_guarantee) noexcept
            {
                static_assert((CONTROL_BITS & LfQueue_External) == 0, ""); /* External blocks are
                    decided by the tail layers. The upper layers shouldn't use this flag. */
                switch (i_progress_guarantee)
                {
                case progress_wait_free:
                    return static_cast<DERIVED *>(this)
                      ->template try_inplace_allocate_impl<
                        detail::LfQueue_WaitFree,
                        CONTROL_BITS,
                        INCLUDE_TYPE,
                        SIZE,
                        ALIGNMENT>();

                case progress_lock_free:
                case progress_obstruction_free:
                    return static_cast<DERIVED *>(this)
                      ->template try_inplace_allocate_impl<
                        detail::LfQueue_LockFree,
                        CONTROL_BITS,
                        INCLUDE_TYPE,
                        SIZE,
                        ALIGNMENT>();

                default:
                    DENSITY_ASSUME(false); // fall-through to progress_blocking to avoid 'not all
                                           // control paths return a value' warnings
                case progress_blocking:
                    return static_cast<DERIVED *>(this)
                      ->template try_inplace_allocate_impl<
                        detail::LfQueue_Blocking,
                        CONTROL_BITS,
                        INCLUDE_TYPE,
                        SIZE,
                        ALIGNMENT>();
                }
            }